

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ComputeGeneratedColumns(Parse *pParse,int iRegStore,Table *pTab)

{
  byte *pbVar1;
  ushort uVar2;
  Vdbe *pVVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  ushort uVar7;
  i16 iVar8;
  Op *pOVar9;
  Expr *pExpr;
  int iVar10;
  Column *pCVar11;
  ushort uVar12;
  long lVar13;
  Column *pCol;
  Walker local_60;
  
  sqlite3TableAffinity(pParse->pVdbe,pTab,iRegStore);
  if ((pTab->tabFlags & 0x40) != 0) {
    pVVar3 = pParse->pVdbe;
    if (pVVar3->db->mallocFailed == '\0') {
      pOVar9 = pVVar3->aOp + (long)pVVar3->nOp + -1;
    }
    else {
      pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pOVar9->opcode == '_') {
      pOVar9->p3 = 1;
    }
    else if (pOVar9->opcode == '`') {
      pvVar4 = (pOVar9->p4).p;
      iVar10 = 0;
      lVar13 = 0xe;
      while (*(char *)((long)pvVar4 + (long)iVar10) != '\0') {
        uVar7 = *(ushort *)((long)&pTab->aCol->zCnName + lVar13);
        if ((uVar7 & 0x20) == 0) {
          if ((uVar7 & 0x40) != 0) {
            *(undefined1 *)((long)pvVar4 + (long)iVar10) = 0x40;
          }
          iVar10 = iVar10 + 1;
        }
        lVar13 = lVar13 + 0x10;
      }
    }
  }
  uVar7 = pTab->nCol;
  lVar13 = 0;
  uVar12 = uVar7;
  if ((short)uVar7 < 1) {
    uVar12 = 0;
  }
  for (; (ulong)uVar12 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
    uVar2 = *(ushort *)((long)&pTab->aCol->colFlags + lVar13);
    if ((uVar2 & 0x60) != 0) {
      *(ushort *)((long)&pTab->aCol->colFlags + lVar13) = uVar2 | 0x80;
    }
  }
  local_60.xExprCallback = exprColumnFlagUnion;
  local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  pParse->iSelfTab = -iRegStore;
  lVar13 = 0;
  bVar5 = false;
  pCol = (Column *)0x0;
  local_60.u.pTab = pTab;
  do {
    while (pCVar11 = pCol, (short)uVar7 <= lVar13) {
      if (pCVar11 == (Column *)0x0) goto LAB_00187373;
      lVar13 = 0;
      bVar6 = !bVar5;
      pCol = (Column *)0x0;
      bVar5 = false;
      if (bVar6) {
LAB_00187373:
        if (pCVar11 != (Column *)0x0) {
          sqlite3ErrorMsg(pParse,"generated column loop on \"%s\"",pCVar11->zCnName);
        }
        pParse->iSelfTab = 0;
        return;
      }
    }
    uVar7 = pTab->aCol[lVar13].colFlags;
    pCol = pCVar11;
    if ((char)uVar7 < '\0') {
      pCol = pTab->aCol + lVar13;
      pCol->colFlags = uVar7 | 0x100;
      local_60.eCode = 0;
      pExpr = sqlite3ColumnExpr(pTab,pCol);
      sqlite3WalkExpr(&local_60,pExpr);
      pbVar1 = (byte *)((long)&pCol->colFlags + 1);
      *pbVar1 = *pbVar1 & 0xfe;
      if ((local_60.eCode & 0x80) == 0) {
        iVar8 = sqlite3TableColumnToStorage(pTab,(i16)lVar13);
        sqlite3ExprCodeGeneratedColumn(pParse,pTab,pCol,iVar8 + iRegStore);
        *(byte *)&pCol->colFlags = (byte)pCol->colFlags & 0x7f;
        bVar5 = true;
        pCol = pCVar11;
      }
    }
    lVar13 = lVar13 + 1;
    uVar7 = pTab->nCol;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3ComputeGeneratedColumns(
  Parse *pParse,    /* Parsing context */
  int iRegStore,    /* Register holding the first column */
  Table *pTab       /* The table */
){
  int i;
  Walker w;
  Column *pRedo;
  int eProgress;
  VdbeOp *pOp;

  assert( pTab->tabFlags & TF_HasGenerated );
  testcase( pTab->tabFlags & TF_HasVirtual );
  testcase( pTab->tabFlags & TF_HasStored );

  /* Before computing generated columns, first go through and make sure
  ** that appropriate affinity has been applied to the regular columns
  */
  sqlite3TableAffinity(pParse->pVdbe, pTab, iRegStore);
  if( (pTab->tabFlags & TF_HasStored)!=0 ){
    pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Affinity ){
      /* Change the OP_Affinity argument to '@' (NONE) for all stored
      ** columns.  '@' is the no-op affinity and those columns have not
      ** yet been computed. */
      int ii, jj;
      char *zP4 = pOp->p4.z;
      assert( zP4!=0 );
      assert( pOp->p4type==P4_DYNAMIC );
      for(ii=jj=0; zP4[jj]; ii++){
        if( pTab->aCol[ii].colFlags & COLFLAG_VIRTUAL ){
          continue;
        }
        if( pTab->aCol[ii].colFlags & COLFLAG_STORED ){
          zP4[jj] = SQLITE_AFF_NONE;
        }
        jj++;
      }
    }else if( pOp->opcode==OP_TypeCheck ){
      /* If an OP_TypeCheck was generated because the table is STRICT,
      ** then set the P3 operand to indicate that generated columns should
      ** not be checked */
      pOp->p3 = 1;
    }
  }

  /* Because there can be multiple generated columns that refer to one another,
  ** this is a two-pass algorithm.  On the first pass, mark all generated
  ** columns as "not available".
  */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].colFlags & COLFLAG_GENERATED ){
      testcase( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL );
      testcase( pTab->aCol[i].colFlags & COLFLAG_STORED );
      pTab->aCol[i].colFlags |= COLFLAG_NOTAVAIL;
    }
  }

  w.u.pTab = pTab;
  w.xExprCallback = exprColumnFlagUnion;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;

  /* On the second pass, compute the value of each NOT-AVAILABLE column.
  ** Companion code in the TK_COLUMN case of sqlite3ExprCodeTarget() will
  ** compute dependencies and mark remove the COLSPAN_NOTAVAIL mark, as
  ** they are needed.
  */
  pParse->iSelfTab = -iRegStore;
  do{
    eProgress = 0;
    pRedo = 0;
    for(i=0; i<pTab->nCol; i++){
      Column *pCol = pTab->aCol + i;
      if( (pCol->colFlags & COLFLAG_NOTAVAIL)!=0 ){
        int x;
        pCol->colFlags |= COLFLAG_BUSY;
        w.eCode = 0;
        sqlite3WalkExpr(&w, sqlite3ColumnExpr(pTab, pCol));
        pCol->colFlags &= ~COLFLAG_BUSY;
        if( w.eCode & COLFLAG_NOTAVAIL ){
          pRedo = pCol;
          continue;
        }
        eProgress = 1;
        assert( pCol->colFlags & COLFLAG_GENERATED );
        x = sqlite3TableColumnToStorage(pTab, i) + iRegStore;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, x);
        pCol->colFlags &= ~COLFLAG_NOTAVAIL;
      }
    }
  }while( pRedo && eProgress );
  if( pRedo ){
    sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"", pRedo->zCnName);
  }
  pParse->iSelfTab = 0;
}